

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O0

void __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::recursive_traversal
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this,
          rt_traversal_wrapper<viennamath::rt_expression_interface<double>_> *fw)

{
  bool bVar1;
  element_type *peVar2;
  rt_traversal_wrapper<viennamath::rt_expression_interface<double>_> *fw_local;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  bVar1 = rt_traversal_wrapper<viennamath::rt_expression_interface<double>_>::step_into
                    (fw,&this->super_rt_expression_interface<double>);
  if (bVar1) {
    peVar2 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->lhs_);
    (*peVar2->_vptr_rt_expression_interface[0xd])(peVar2,fw);
    rt_traversal_wrapper<viennamath::rt_expression_interface<double>_>::operator()
              (fw,&this->super_rt_expression_interface<double>);
    peVar2 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->rhs_);
    (*peVar2->_vptr_rt_expression_interface[0xd])(peVar2,fw);
  }
  else {
    rt_traversal_wrapper<viennamath::rt_expression_interface<double>_>::operator()
              (fw,&this->super_rt_expression_interface<double>);
  }
  return;
}

Assistant:

void recursive_traversal(rt_traversal_wrapper<InterfaceType> const & fw) const
      {
        if (fw.step_into(this))
        {
          lhs_->recursive_traversal(fw);
          fw(this);
          rhs_->recursive_traversal(fw);
        }
        else
          fw(this);
      }